

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void new_mem_loc(gen_ctx_t gen_ctx,MIR_op_t *mem_op_ref,int flag)

{
  byte bVar1;
  MIR_alias_t MVar2;
  MIR_alias_t MVar3;
  uint uVar4;
  VARR_mem_attr_t *pVVar5;
  long lVar6;
  int iVar7;
  mem_attr_t *pmVar8;
  ulong uVar9;
  bitmap_t pVVar10;
  uint extraout_EDX;
  char *pcVar11;
  long lVar12;
  uchar uVar13;
  FILE *pFVar14;
  gen_ctx_t __ptr;
  gen_ctx_t insn;
  int64_t iVar15;
  size_t sVar16;
  
  if (gen_ctx->mem_attrs == (VARR_mem_attr_t *)0x0) {
    new_mem_loc_cold_4();
    pFVar14 = (FILE *)mem_op_ref;
    __ptr = gen_ctx;
LAB_001685a2:
    new_mem_loc_cold_3();
  }
  else {
    iVar7 = (int)gen_ctx->mem_attrs->els_num;
    (mem_op_ref->u).mem.nloc = iVar7 + (uint)(iVar7 == 0);
    bVar1 = *(byte *)&mem_op_ref->u;
    MVar2 = (mem_op_ref->u).mem.alias;
    MVar3 = (mem_op_ref->u).mem.nonalias;
    pFVar14 = (FILE *)mem_op_ref;
    if ((flag & 2U) != 0) {
      pVVar10 = (bitmap_t)mem_op_ref->data;
      if (pVVar10 != (bitmap_t)0x0) {
        iVar15 = 0;
        do {
          insn = *(gen_ctx_t *)pVVar10->size;
          __ptr = insn;
          iVar7 = move_p((MIR_insn_t)insn);
          if (iVar7 == 0) {
            uVar4 = *(uint *)&insn->debug_file;
            uVar13 = '\x01';
            if ((((0x28 < (ulong)uVar4) || ((0x18c00000000U >> ((ulong)uVar4 & 0x3f) & 1) == 0)) ||
                (insn->call_used_hard_regs[3] == (bitmap_t)0x0)) ||
               (sVar16 = insn->call_used_hard_regs[3]->size, *(char *)(sVar16 + 8) == '\0'))
            goto LAB_00168346;
            lVar6 = *(long *)(sVar16 + 0x18);
            lVar12 = -lVar6;
            if ((uVar4 & 0xfffffffe) == 0x22) {
              lVar12 = lVar6;
            }
            iVar15 = lVar12 + iVar15;
          }
          pVVar10 = insn->temp_bitmap;
        } while (pVVar10 != (bitmap_t)0x0);
      }
      __assert_fail("se != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0xffc,"ssa_edge_t skip_move_ssa_edges(ssa_edge_t, MIR_insn_t *)");
    }
    insn = (gen_ctx_t)0x0;
    iVar15 = 0;
    uVar13 = '\0';
    __ptr = gen_ctx;
LAB_00168346:
    pVVar5 = gen_ctx->mem_attrs;
    if (pVVar5 == (VARR_mem_attr_t *)0x0) goto LAB_001685a2;
    if (pVVar5->els_num == 0) {
      __ptr = (gen_ctx_t)pVVar5->varr;
      if (__ptr == (gen_ctx_t)0x0) goto LAB_001685ac;
      if (pVVar5->size == 0) {
        pFVar14 = (FILE *)0x20;
        pmVar8 = (mem_attr_t *)realloc(__ptr,0x20);
        pVVar5->varr = pmVar8;
        pVVar5->size = 1;
      }
      sVar16 = pVVar5->els_num;
      pmVar8 = pVVar5->varr;
      pVVar5->els_num = sVar16 + 1;
      pmVar8[sVar16].alloca_flag = (uchar)flag;
      pmVar8[sVar16].disp_def_p = uVar13;
      pmVar8[sVar16].type = (uint)bVar1;
      pmVar8[sVar16].alias = MVar2;
      pmVar8[sVar16].nonalias = MVar3;
      pmVar8[sVar16].def_insn = (MIR_insn_t)insn;
      pmVar8[sVar16].disp = iVar15;
    }
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fprintf((FILE *)gen_ctx->debug_file,"    new m%lu",(ulong)(mem_op_ref->u).mem.nloc);
      if (insn != (gen_ctx_t)0x0) {
        fprintf((FILE *)gen_ctx->debug_file,"(def_insn=%u)",
                (ulong)*(uint *)((long)&insn->ctx->c2mir_ctx + 4));
      }
      if ((flag & 2U) != 0) {
        fprintf((FILE *)gen_ctx->debug_file,"(disp=%lld)",iVar15);
      }
      if (flag != 0) {
        pcVar11 = "may/must";
        if ((flag & 3U) == 0) {
          pcVar11 = "must";
        }
        fprintf((FILE *)gen_ctx->debug_file," is %s alloca based",pcVar11);
      }
      pFVar14 = (FILE *)gen_ctx->debug_file;
      fputc(10,pFVar14);
    }
    pVVar5 = gen_ctx->mem_attrs;
    __ptr = (gen_ctx_t)pVVar5->varr;
    if (__ptr != (gen_ctx_t)0x0) {
      uVar9 = pVVar5->els_num + 1;
      if (pVVar5->size < uVar9) {
        sVar16 = (uVar9 >> 1) + uVar9;
        pmVar8 = (mem_attr_t *)realloc(__ptr,sVar16 * 0x20);
        pVVar5->varr = pmVar8;
        pVVar5->size = sVar16;
      }
      sVar16 = pVVar5->els_num;
      pmVar8 = pVVar5->varr;
      pVVar5->els_num = sVar16 + 1;
      pmVar8[sVar16].alloca_flag = (uchar)flag;
      pmVar8[sVar16].disp_def_p = uVar13;
      pmVar8[sVar16].type = (uint)bVar1;
      pmVar8[sVar16].alias = MVar2;
      pmVar8[sVar16].nonalias = MVar3;
      pmVar8[sVar16].def_insn = (MIR_insn_t)insn;
      pmVar8[sVar16].disp = iVar15;
      return;
    }
  }
  new_mem_loc_cold_1();
LAB_001685ac:
  new_mem_loc_cold_2();
  pVVar5 = __ptr->mem_attrs;
  if (pVVar5 == (VARR_mem_attr_t *)0x0) {
    update_mem_loc_alloca_flag_cold_1();
  }
  else if (pFVar14 < (FILE *)pVVar5->els_num) {
    bVar1 = pVVar5->varr[(long)pFVar14].alloca_flag;
    pVVar5->varr[(long)pFVar14].alloca_flag =
         (byte)extraout_EDX & bVar1 & 2 | (bVar1 | (byte)extraout_EDX) & 1;
    if ((((FILE *)__ptr->debug_file != (FILE *)0x0) &&
        (1 < *(int *)&((MIR_op_t *)&__ptr->debug_level)->data)) && (bVar1 != extraout_EDX)) {
      fprintf((FILE *)__ptr->debug_file,"    m%lu ");
      if (extraout_EDX == 0) {
        fwrite("is no more alloca based\n",0x18,1,(FILE *)__ptr->debug_file);
        return;
      }
      pcVar11 = "may/must";
      if ((extraout_EDX & 3) == 0) {
        pcVar11 = "must";
      }
      fprintf((FILE *)__ptr->debug_file,"becomes %s alloca based\n",pcVar11);
      return;
    }
    return;
  }
  __assert_fail("(VARR_mem_attr_tlength (gen_ctx->mem_attrs)) > nloc",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x103a,"void update_mem_loc_alloca_flag(gen_ctx_t, size_t, int)");
}

Assistant:

static void new_mem_loc (gen_ctx_t gen_ctx, MIR_op_t *mem_op_ref, int flag) {
  /* zero loc is fixed: */
  int64_t disp;
  mem_attr_t mem_attr;

  if ((mem_op_ref->u.var_mem.nloc = (uint32_t) VARR_LENGTH (mem_attr_t, mem_attrs)) == 0)
    mem_op_ref->u.var_mem.nloc = 1;
  mem_attr.alloca_flag = flag;
  mem_attr.type = mem_op_ref->u.var_mem.type;
  mem_attr.alias = mem_op_ref->u.var_mem.alias;
  mem_attr.nonalias = mem_op_ref->u.var_mem.nonalias;
  mem_attr.disp_def_p = FALSE;
  mem_attr.disp = 0;
  mem_attr.def_insn = NULL;
  if ((flag & MUST_ALLOCA) != 0) {
    mem_attr.def_insn = get_def_disp (mem_op_ref->data, &disp);
    mem_attr.disp_def_p = TRUE;
    mem_attr.disp = disp;
  }
  if (VARR_LENGTH (mem_attr_t, mem_attrs) == 0) VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
  DEBUG (2, {
    fprintf (debug_file, "    new m%lu", (unsigned long) mem_op_ref->u.var_mem.nloc);
    if (mem_attr.def_insn != NULL)
      fprintf (debug_file, "(def_insn=%u)", ((bb_insn_t) mem_attr.def_insn->data)->index);
    if (mem_attr.disp_def_p) fprintf (debug_file, "(disp=%lld)", (long long) mem_attr.disp);
    if (flag)
      fprintf (debug_file, " is %s alloca based",
               flag & (MAY_ALLOCA | MUST_ALLOCA) ? "may/must"
               : flag & MAY_ALLOCA               ? "may"
                                                 : "must");
    fprintf (debug_file, "\n");
  });
  VARR_PUSH (mem_attr_t, mem_attrs, mem_attr);
}